

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O1

int mbedtls_ecdh_read_public(mbedtls_ecdh_context *ctx,uchar *buf,size_t blen)

{
  int iVar1;
  int iVar2;
  uchar *p;
  uchar *local_20;
  
  local_20 = buf;
  iVar1 = mbedtls_ecp_tls_read_point(&ctx->grp,&ctx->Qp,&local_20,blen);
  iVar2 = -0x4f80;
  if ((long)local_20 - (long)buf == blen) {
    iVar2 = 0;
  }
  if (iVar1 == 0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdh_read_public( mbedtls_ecdh_context *ctx,
                              const unsigned char *buf, size_t blen )
{
    ECDH_VALIDATE_RET( ctx != NULL );
    ECDH_VALIDATE_RET( buf != NULL );

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return( ecdh_read_public_internal( ctx, buf, blen ) );
#else
    switch( ctx->var )
    {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
            return( mbedtls_everest_read_public( &ctx->ctx.everest_ecdh,
                                                 buf, blen ) );
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return( ecdh_read_public_internal( &ctx->ctx.mbed_ecdh,
                                                       buf, blen ) );
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
#endif
}